

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamToolsIndex::ReadBlock(BamToolsIndex *this,BtiBlock *block)

{
  long lVar1;
  undefined8 uVar2;
  int32_t *in_RSI;
  long in_RDI;
  int expectedBytes;
  int64_t numBytesRead;
  allocator local_79;
  string local_78 [8];
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  BamException *in_stack_ffffffffffffffa0;
  allocator local_41;
  string local_40 [36];
  undefined4 local_1c;
  long local_18;
  int32_t *local_10;
  
  local_18 = 0;
  local_10 = in_RSI;
  lVar1 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x28))(*(long **)(in_RDI + 0x60),in_RSI,4);
  local_18 = lVar1 + local_18;
  lVar1 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x28))(*(long **)(in_RDI + 0x60),local_10 + 2,8)
  ;
  local_18 = lVar1 + local_18;
  lVar1 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x28))(*(long **)(in_RDI + 0x60),local_10 + 4,4)
  ;
  local_18 = lVar1 + local_18;
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    SwapEndian_32(local_10);
    SwapEndian_64((int64_t *)(local_10 + 2));
    SwapEndian_32(local_10 + 4);
  }
  local_1c = 0x10;
  if (local_18 != 0x10) {
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"BamToolsIndex::ReadBlock",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"could not read block",&local_79);
    BamException::BamException
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    __cxa_throw(uVar2,&BamException::typeinfo,BamException::~BamException);
  }
  return;
}

Assistant:

void BamToolsIndex::ReadBlock(BtiBlock& block)
{

    // read in block data members
    int64_t numBytesRead = 0;
    numBytesRead +=
        m_resources.Device->Read((char*)&block.MaxEndPosition, sizeof(block.MaxEndPosition));
    numBytesRead += m_resources.Device->Read((char*)&block.StartOffset, sizeof(block.StartOffset));
    numBytesRead +=
        m_resources.Device->Read((char*)&block.StartPosition, sizeof(block.StartPosition));

    // swap endian-ness if necessary
    if (m_isBigEndian) {
        SwapEndian_32(block.MaxEndPosition);
        SwapEndian_64(block.StartOffset);
        SwapEndian_32(block.StartPosition);
    }

    // check block read ok
    const int expectedBytes =
        sizeof(block.MaxEndPosition) + sizeof(block.StartOffset) + sizeof(block.StartPosition);
    if (numBytesRead != expectedBytes)
        throw BamException("BamToolsIndex::ReadBlock", "could not read block");
}